

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O3

int WebPGetInfo(uint8_t *data,size_t data_size,int *width,int *height)

{
  VP8StatusCode VVar1;
  int iVar2;
  WebPBitstreamFeatures features;
  
  if (data == (uint8_t *)0x0) {
    iVar2 = 0;
  }
  else {
    features.format = 0;
    features.pad[0] = 0;
    features.pad[1] = 0;
    features.pad[2] = 0;
    features.width = 0;
    features.height = 0;
    features.has_alpha = 0;
    features.has_animation = 0;
    iVar2 = 0;
    features.pad[3] = 0;
    features.pad[4] = 0;
    VVar1 = ParseHeadersInternal
                      (data,data_size,&features.width,&features.height,&features.has_alpha,
                       &features.has_animation,&features.format,(WebPHeaderStructure *)0x0);
    if (VVar1 == VP8_STATUS_OK) {
      if (width != (int *)0x0) {
        *width = features.width;
      }
      iVar2 = 1;
      if (height != (int *)0x0) {
        *height = features.height;
      }
    }
  }
  return iVar2;
}

Assistant:

int WebPGetInfo(const uint8_t* data, size_t data_size,
                int* width, int* height) {
  WebPBitstreamFeatures features;

  if (GetFeatures(data, data_size, &features) != VP8_STATUS_OK) {
    return 0;
  }

  if (width != NULL) {
    *width  = features.width;
  }
  if (height != NULL) {
    *height = features.height;
  }

  return 1;
}